

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

string * __thiscall
supermap::BloomFilter<supermap::Key<2ul>>::serialize_abi_cxx11_
          (BloomFilter<supermap::Key<2UL>_> *this,Key<2UL> *value)

{
  string *in_RDI;
  stringstream stream;
  ostream *in_stack_fffffffffffffe38;
  string *value_00;
  stringstream local_1a0 [416];
  
  value_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  io::serialize<supermap::Key<2ul>,void>((Key<2UL> *)value_00,in_stack_fffffffffffffe38);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string serialize(const T &value) const {
        std::stringstream stream;
        io::serialize(value, stream);
        return stream.str();
    }